

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plp.cc
# Opt level: O1

int main(int argc,char **argv)

{
  InputOutputFormats input_format;
  double dVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  ostream *poVar8;
  size_t sVar9;
  char *__s;
  double *energy_00;
  string *input_stream;
  uint uVar10;
  double dVar11;
  int fft_length;
  int num_order;
  int liftering_coefficient;
  int num_channel;
  double highest_frequency;
  double lowest_frequency;
  double floor;
  double sampling_rate;
  double compression_factor;
  ostringstream error_message_15;
  double energy;
  vector<double,_std::allocator<double>_> output;
  ifstream ifs;
  vector<double,_std::allocator<double>_> processed_input;
  vector<double,_std::allocator<double>_> input;
  PerceptualLinearPredictiveCoefficientsAnalysis analysis;
  SpectrumToSpectrum spectrum_to_spectrum;
  Buffer buffer_for_spectral_analysis;
  WaveformToSpectrum waveform_to_spectrum;
  Buffer buffer_for_plp_analysis;
  int local_834;
  InputOutputFormats local_830;
  int local_82c;
  string local_828;
  int local_808;
  int local_804;
  double local_800;
  ulong local_7f8;
  ulong local_7f0;
  double local_7e8;
  double local_7e0;
  double local_7d8;
  double local_7d0;
  string local_7c8 [3];
  ios_base local_758 [264];
  double local_650;
  double local_648;
  vector<double,_std::allocator<double>_> local_640;
  string local_628;
  byte abStack_608 [80];
  ios_base local_5b8 [408];
  vector<double,_std::allocator<double>_> local_420;
  vector<double,_std::allocator<double>_> local_408;
  PerceptualLinearPredictiveCoefficientsAnalysis local_3f0;
  SpectrumToSpectrum local_2f8;
  Buffer local_2b0;
  WaveformToSpectrum local_1f0;
  Buffer local_100;
  
  local_804 = 0x14;
  local_82c = 0xc;
  local_834 = 0x100;
  local_808 = 0x16;
  local_7d0 = 0.33;
  local_7d8 = 16.0;
  local_7e8 = 0.0;
  local_7f0 = 0;
  local_800 = 0.0;
  local_7e0 = 1.0;
  local_830 = kNumInputOutputFormats;
  local_7f8 = 0;
  iVar6 = 0;
  do {
    iVar5 = ya_getopt_long(argc,argv,"n:m:l:c:f:s:L:H:q:o:e:h",(option *)0x0,(int *)0x0);
    if (iVar5 < 99) {
      if (iVar5 != -1) {
        if (iVar5 == 0x48) {
          std::__cxx11::string::string((string *)&local_628,ya_optarg,(allocator *)local_7c8);
          bVar2 = sptk::ConvertStringToDouble(&local_628,&local_800);
          bVar3 = local_800 <= 0.0;
          paVar7 = &local_628.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_628._M_dataplus._M_p != paVar7) {
            operator_delete(local_628._M_dataplus._M_p);
            paVar7 = extraout_RAX;
          }
          if (!bVar2 || bVar3) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_628);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_628,
                       "The argument for the -H option must be a positive number",0x38);
            local_7c8[0]._M_dataplus._M_p = (pointer)&local_7c8[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"plp","");
            sptk::PrintErrorMessage(local_7c8,(ostringstream *)&local_628);
            goto LAB_00105357;
          }
          local_7f8 = CONCAT71((int7)((ulong)paVar7 >> 8),1);
        }
        else {
          if (iVar5 != 0x4c) goto switchD_00104a3c_caseD_64;
          std::__cxx11::string::string((string *)&local_628,ya_optarg,(allocator *)local_7c8);
          bVar2 = sptk::ConvertStringToDouble(&local_628,&local_7e8);
          bVar3 = local_7e8 < 0.0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_628._M_dataplus._M_p != &local_628.field_2) {
            operator_delete(local_628._M_dataplus._M_p);
          }
          if (!bVar2 || bVar3) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_628);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_628,"The argument for the -L option must be a ",0x29);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_628,"non-negative number",0x13);
            local_7c8[0]._M_dataplus._M_p = (pointer)&local_7c8[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"plp","");
            sptk::PrintErrorMessage(local_7c8,(ostringstream *)&local_628);
            goto LAB_00105357;
          }
        }
        goto LAB_001052fb;
      }
      iVar5 = 2;
      goto LAB_00105398;
    }
    switch(iVar5) {
    case 99:
      std::__cxx11::string::string((string *)&local_628,ya_optarg,(allocator *)local_7c8);
      bVar2 = sptk::ConvertStringToInteger(&local_628,&local_808);
      bVar3 = local_808 < 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_628._M_dataplus._M_p != &local_628.field_2) {
        operator_delete(local_628._M_dataplus._M_p);
      }
      if (!bVar2 || bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_628);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_628,"The argument for the -c option must be a positive integer"
                   ,0x39);
        local_7c8[0]._M_dataplus._M_p = (pointer)&local_7c8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"plp","");
        sptk::PrintErrorMessage(local_7c8,(ostringstream *)&local_628);
LAB_00105357:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7c8[0]._M_dataplus._M_p != &local_7c8[0].field_2) {
          operator_delete(local_7c8[0]._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_628);
        std::ios_base::~ios_base(local_5b8);
        goto LAB_0010538d;
      }
      break;
    default:
switchD_00104a3c_caseD_64:
      anon_unknown.dwarf_2cc4::PrintUsage((ostream *)&std::cerr);
LAB_0010538d:
      iVar5 = 1;
      iVar6 = 1;
      goto LAB_00105398;
    case 0x65:
      std::__cxx11::string::string((string *)&local_628,ya_optarg,(allocator *)local_7c8);
      bVar2 = sptk::ConvertStringToDouble(&local_628,&local_7e0);
      bVar3 = local_7e0 <= 0.0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_628._M_dataplus._M_p != &local_628.field_2) {
        operator_delete(local_628._M_dataplus._M_p);
      }
      if (!bVar2 || bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_628);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_628,"The argument for the -e option must be a positive number",
                   0x38);
        local_7c8[0]._M_dataplus._M_p = (pointer)&local_7c8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"plp","");
        sptk::PrintErrorMessage(local_7c8,(ostringstream *)&local_628);
        goto LAB_00105357;
      }
      break;
    case 0x66:
      std::__cxx11::string::string((string *)&local_628,ya_optarg,(allocator *)local_7c8);
      bVar2 = sptk::ConvertStringToDouble(&local_628,&local_7d0);
      bVar3 = local_7d0 <= 0.0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_628._M_dataplus._M_p != &local_628.field_2) {
        operator_delete(local_628._M_dataplus._M_p);
      }
      if (!bVar2 || bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_628);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_628,"The argument for the -f option must be a positive number",
                   0x38);
        local_7c8[0]._M_dataplus._M_p = (pointer)&local_7c8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"plp","");
        sptk::PrintErrorMessage(local_7c8,(ostringstream *)&local_628);
        goto LAB_00105357;
      }
      break;
    case 0x68:
      anon_unknown.dwarf_2cc4::PrintUsage((ostream *)&std::cout);
      iVar6 = 0;
      iVar5 = 1;
      goto LAB_00105398;
    case 0x6c:
      std::__cxx11::string::string((string *)&local_628,ya_optarg,(allocator *)local_7c8);
      bVar3 = sptk::ConvertStringToInteger(&local_628,&local_834);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_628._M_dataplus._M_p != &local_628.field_2) {
        operator_delete(local_628._M_dataplus._M_p);
      }
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_628);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_628,"The argument for the -l option must be an integer",0x31);
        local_7c8[0]._M_dataplus._M_p = (pointer)&local_7c8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"plp","");
        sptk::PrintErrorMessage(local_7c8,(ostringstream *)&local_628);
        goto LAB_00105357;
      }
      break;
    case 0x6d:
      std::__cxx11::string::string((string *)&local_628,ya_optarg,(allocator *)local_7c8);
      bVar2 = sptk::ConvertStringToInteger(&local_628,&local_82c);
      bVar3 = local_82c < 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_628._M_dataplus._M_p != &local_628.field_2) {
        operator_delete(local_628._M_dataplus._M_p);
      }
      if (!bVar2 || bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_628);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_628,"The argument for the -m option must be a positive integer"
                   ,0x39);
        local_7c8[0]._M_dataplus._M_p = (pointer)&local_7c8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"plp","");
        sptk::PrintErrorMessage(local_7c8,(ostringstream *)&local_628);
        goto LAB_00105357;
      }
      break;
    case 0x6e:
      std::__cxx11::string::string((string *)&local_628,ya_optarg,(allocator *)local_7c8);
      bVar2 = sptk::ConvertStringToInteger(&local_628,&local_804);
      bVar3 = local_804 < 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_628._M_dataplus._M_p != &local_628.field_2) {
        operator_delete(local_628._M_dataplus._M_p);
      }
      if (!bVar2 || bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_628);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_628,"The argument for the -n option must be a positive integer"
                   ,0x39);
        local_7c8[0]._M_dataplus._M_p = (pointer)&local_7c8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"plp","");
        sptk::PrintErrorMessage(local_7c8,(ostringstream *)&local_628);
        goto LAB_00105357;
      }
      break;
    case 0x6f:
      std::__cxx11::string::string((string *)&local_628,ya_optarg,(allocator *)local_7c8);
      bVar3 = sptk::ConvertStringToInteger(&local_628,(int *)&local_3f0);
      if (!bVar3) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_628._M_dataplus._M_p != &local_628.field_2) {
          operator_delete(local_628._M_dataplus._M_p);
        }
LAB_00105221:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_628);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_628,"The argument for the -o option must be an integer ",0x32);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_628,"in the range of ",0x10);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&local_628,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," to ",4);
        std::ostream::operator<<((ostream *)poVar8,3);
        local_7c8[0]._M_dataplus._M_p = (pointer)&local_7c8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"plp","");
        sptk::PrintErrorMessage(local_7c8,(ostringstream *)&local_628);
        goto LAB_001052b0;
      }
      bVar3 = sptk::IsInRange((InputOutputFormats)
                              local_3f0._vptr_PerceptualLinearPredictiveCoefficientsAnalysis,0,3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_628._M_dataplus._M_p != &local_628.field_2) {
        operator_delete(local_628._M_dataplus._M_p);
      }
      if (!bVar3) goto LAB_00105221;
      iVar5 = 4;
      bVar3 = true;
      local_7f0 = (ulong)local_3f0._vptr_PerceptualLinearPredictiveCoefficientsAnalysis & 0xffffffff
      ;
      goto LAB_001052f3;
    case 0x71:
      std::__cxx11::string::string((string *)&local_628,ya_optarg,(allocator *)local_7c8);
      bVar3 = sptk::ConvertStringToInteger(&local_628,(int *)&local_3f0);
      if (bVar3) {
        bVar3 = sptk::IsInRange((InputOutputFormats)
                                local_3f0._vptr_PerceptualLinearPredictiveCoefficientsAnalysis,0,4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_628._M_dataplus._M_p != &local_628.field_2) {
          operator_delete(local_628._M_dataplus._M_p);
        }
        if (bVar3) {
          iVar5 = 4;
          bVar3 = true;
          local_830 = (InputOutputFormats)
                      local_3f0._vptr_PerceptualLinearPredictiveCoefficientsAnalysis;
          goto LAB_001052f3;
        }
      }
      else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_628._M_dataplus._M_p != &local_628.field_2) {
        operator_delete(local_628._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_628);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_628,"The argument for the -q option must be an integer ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_628,"in the range of ",0x10);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&local_628,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," to ",4);
      std::ostream::operator<<((ostream *)poVar8,4);
      local_7c8[0]._M_dataplus._M_p = (pointer)&local_7c8[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"plp","");
      sptk::PrintErrorMessage(local_7c8,(ostringstream *)&local_628);
LAB_001052b0:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7c8[0]._M_dataplus._M_p != &local_7c8[0].field_2) {
        operator_delete(local_7c8[0]._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_628);
      std::ios_base::~ios_base(local_5b8);
      iVar5 = 1;
      bVar3 = false;
      iVar6 = 1;
LAB_001052f3:
      if (bVar3) break;
      goto LAB_00105398;
    case 0x73:
      std::__cxx11::string::string((string *)&local_628,ya_optarg,(allocator *)local_7c8);
      bVar2 = sptk::ConvertStringToDouble(&local_628,&local_7d8);
      bVar3 = local_7d8 <= 0.0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_628._M_dataplus._M_p != &local_628.field_2) {
        operator_delete(local_628._M_dataplus._M_p);
      }
      if (!bVar2 || bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_628);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_628,"The argument for the -s option must be a positive number",
                   0x38);
        local_7c8[0]._M_dataplus._M_p = (pointer)&local_7c8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"plp","");
        sptk::PrintErrorMessage(local_7c8,(ostringstream *)&local_628);
        goto LAB_00105357;
      }
    }
LAB_001052fb:
    iVar5 = 0;
LAB_00105398:
    input_format = local_830;
  } while (iVar5 == 0);
  if (iVar5 == 2) {
    dVar11 = local_7d8 * 1000.0 * 0.5;
    dVar1 = dVar11;
    if (((local_7f8 & 1) == 0) || (dVar1 = local_800, local_800 <= dVar11)) {
      local_800 = dVar1;
      if (local_800 <= local_7e8) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_628);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_628,"Lowest frequency must be less than highest one",0x2e);
        local_7c8[0]._M_dataplus._M_p = (pointer)&local_7c8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"plp","");
        sptk::PrintErrorMessage(local_7c8,(ostringstream *)&local_628);
      }
      else if (argc - ya_optind < 2) {
        if (argc == ya_optind) {
          __s = (char *)0x0;
        }
        else {
          __s = argv[ya_optind];
        }
        local_650 = local_7d8 * 1000.0;
        bVar3 = sptk::SetBinaryMode();
        if (bVar3) {
          input_stream = &local_628;
          std::ifstream::ifstream(input_stream);
          if ((__s == (char *)0x0) ||
             (std::ifstream::open((char *)&local_628,(_Ios_Openmode)__s),
             (abStack_608[*(long *)(local_628._M_dataplus._M_p + -0x18)] & 5) == 0)) {
            cVar4 = std::__basic_file<char>::is_open();
            if (cVar4 == '\0') {
              input_stream = (string *)&std::cin;
            }
            sptk::SpectrumToSpectrum::SpectrumToSpectrum
                      (&local_2f8,local_834,input_format,kPowerSpectrum,0.0,-1.79769313486232e+308);
            if ((input_format == kNumInputOutputFormats) || (local_2f8.is_valid_ != false)) {
              sptk::WaveformToSpectrum::WaveformToSpectrum
                        (&local_1f0,local_834,local_834,kPowerSpectrum,0.0,-1.79769313486232e+308);
              local_2b0._vptr_Buffer = (_func_int **)&PTR__Buffer_00119538;
              local_2b0.buffer_._vptr_Buffer = (_func_int **)&PTR__Buffer_00119568;
              local_2b0.buffer_.fast_fourier_transform_buffer_._vptr_Buffer =
                   (_func_int **)&PTR__Buffer_00119598;
              memset(&local_2b0.buffer_.fast_fourier_transform_buffer_.real_part_input_,0,0xa8);
              if ((input_format == kNumInputOutputFormats) &&
                 (local_1f0.filter_coefficients_to_spectrum_.is_valid_ == false)) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7c8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_7c8,"Failed to set condition for spectral analysis",0x2d
                          );
                local_3f0._vptr_PerceptualLinearPredictiveCoefficientsAnalysis =
                     (_func_int **)&local_3f0.compression_factor_;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"plp","");
                sptk::PrintErrorMessage((string *)&local_3f0,(ostringstream *)local_7c8);
                if (local_3f0._vptr_PerceptualLinearPredictiveCoefficientsAnalysis !=
                    (_func_int **)&local_3f0.compression_factor_) {
                  operator_delete(local_3f0._vptr_PerceptualLinearPredictiveCoefficientsAnalysis);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7c8);
                std::ios_base::~ios_base(local_758);
                iVar6 = 1;
              }
              else {
                sptk::PerceptualLinearPredictiveCoefficientsAnalysis::
                PerceptualLinearPredictiveCoefficientsAnalysis
                          (&local_3f0,local_834,local_804,local_82c,local_808,local_7d0,local_650,
                           local_7e8,local_800,local_7e0);
                local_100._vptr_Buffer = (_func_int **)&PTR__Buffer_001195c8;
                memset(&local_100.filter_bank_output_,0,0xa8);
                local_100.buffer_for_levinson_durbin_recursion_._vptr_Buffer =
                     (_func_int **)&PTR__Buffer_001195f8;
                local_100.buffer_for_levinson_durbin_recursion_.c_.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start = (pointer)0x0;
                local_100.buffer_for_levinson_durbin_recursion_.c_.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish = (pointer)0x0;
                local_100.buffer_for_levinson_durbin_recursion_.c_.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage = (pointer)0x0;
                if (local_3f0.is_valid_ == false) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7c8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_7c8,"Failed to set condition for PLP analysis",0x28);
                  local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_828,"plp","");
                  sptk::PrintErrorMessage(&local_828,(ostringstream *)local_7c8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_828._M_dataplus._M_p != &local_828.field_2) {
                    operator_delete(local_828._M_dataplus._M_p);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7c8);
                  std::ios_base::~ios_base(local_758);
                  iVar6 = 1;
                }
                else {
                  iVar6 = local_834;
                  if (input_format != kNumInputOutputFormats) {
                    iVar6 = local_834 / 2 + 1;
                  }
                  local_7f8 = (ulong)local_82c;
                  std::vector<double,_std::allocator<double>_>::vector
                            (&local_408,(long)iVar6,(allocator_type *)local_7c8);
                  std::vector<double,_std::allocator<double>_>::vector
                            (&local_420,(long)(local_834 / 2 + 1),(allocator_type *)local_7c8);
                  std::vector<double,_std::allocator<double>_>::vector
                            (&local_640,local_7f8,(allocator_type *)local_7c8);
                  local_648 = 0.0;
                  uVar10 = (uint)local_7f0 & 0xfffffffd;
                  energy_00 = &local_648;
                  if (uVar10 != 1) {
                    energy_00 = (double *)0x0;
                  }
                  local_7f0 = (ulong)((uint)local_7f0 & 0xfffffffe);
                  do {
                    bVar3 = sptk::ReadStream<double>
                                      (false,0,0,iVar6,&local_408,(istream *)input_stream,(int *)0x0
                                      );
                    if (!bVar3) {
                      iVar6 = 0;
                      goto LAB_00105e55;
                    }
                    if (local_830 == kNumInputOutputFormats) {
                      bVar3 = sptk::WaveformToSpectrum::Run
                                        (&local_1f0,&local_408,&local_420,&local_2b0);
                      if (!bVar3) {
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7c8);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_7c8,"Failed to transform waveform to spectrum",
                                   0x28);
                        local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_828,"plp","");
                        sptk::PrintErrorMessage(&local_828,(ostringstream *)local_7c8);
                        goto LAB_00105e1f;
                      }
                    }
                    else {
                      bVar3 = sptk::SpectrumToSpectrum::Run(&local_2f8,&local_408,&local_420);
                      if (!bVar3) {
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7c8);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_7c8,"Failed to convert spectrum",0x1a);
                        local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_828,"plp","");
                        sptk::PrintErrorMessage(&local_828,(ostringstream *)local_7c8);
                        goto LAB_00105e1f;
                      }
                    }
                    bVar3 = sptk::PerceptualLinearPredictiveCoefficientsAnalysis::Run
                                      (&local_3f0,&local_420,&local_640,energy_00,&local_100);
                    if (!bVar3) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7c8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_7c8,"Failed to run PLP analysis",0x1a);
                      local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
                      std::__cxx11::string::_M_construct<char_const*>((string *)&local_828,"plp","")
                      ;
                      sptk::PrintErrorMessage(&local_828,(ostringstream *)local_7c8);
                      goto LAB_00105e1f;
                    }
                    bVar3 = sptk::WriteStream<double>
                                      (1,(int)local_7f8,&local_640,(ostream *)&std::cout,(int *)0x0)
                    ;
                    if (!bVar3) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7c8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_7c8,"Failed to write PLP",0x13);
                      local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
                      std::__cxx11::string::_M_construct<char_const*>((string *)&local_828,"plp","")
                      ;
                      sptk::PrintErrorMessage(&local_828,(ostringstream *)local_7c8);
                      goto LAB_00105e1f;
                    }
                    if (((int)local_7f0 == 2) &&
                       (bVar3 = sptk::WriteStream<double>
                                          (*local_640.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start,
                                           (ostream *)&std::cout), !bVar3)) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7c8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_7c8,"Failed to write c0",0x12);
                      local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
                      std::__cxx11::string::_M_construct<char_const*>((string *)&local_828,"plp","")
                      ;
                      sptk::PrintErrorMessage(&local_828,(ostringstream *)local_7c8);
                      goto LAB_00105e1f;
                    }
                  } while ((uVar10 != 1) ||
                          (bVar3 = sptk::WriteStream<double>(local_648,(ostream *)&std::cout), bVar3
                          ));
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7c8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_7c8,"Failed to write energy",0x16);
                  local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_828,"plp","");
                  sptk::PrintErrorMessage(&local_828,(ostringstream *)local_7c8);
LAB_00105e1f:
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_828._M_dataplus._M_p != &local_828.field_2) {
                    operator_delete(local_828._M_dataplus._M_p);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7c8);
                  std::ios_base::~ios_base(local_758);
                  iVar6 = 1;
LAB_00105e55:
                  if (local_640.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start != (double *)0x0) {
                    operator_delete(local_640.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
                  }
                  if (local_420.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_420.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
                  }
                  if (local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_408.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
                  }
                }
                sptk::PerceptualLinearPredictiveCoefficientsAnalysis::Buffer::~Buffer(&local_100);
                sptk::PerceptualLinearPredictiveCoefficientsAnalysis::
                ~PerceptualLinearPredictiveCoefficientsAnalysis(&local_3f0);
              }
              local_2b0._vptr_Buffer = (_func_int **)&PTR__Buffer_00119538;
              sptk::FilterCoefficientsToSpectrum::Buffer::~Buffer(&local_2b0.buffer_);
              sptk::WaveformToSpectrum::~WaveformToSpectrum(&local_1f0);
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7c8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_7c8,"Failed to set condition for input formatting",0x2c);
              local_3f0._vptr_PerceptualLinearPredictiveCoefficientsAnalysis =
                   (_func_int **)&local_3f0.compression_factor_;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"plp","");
              sptk::PrintErrorMessage((string *)&local_3f0,(ostringstream *)local_7c8);
              if (local_3f0._vptr_PerceptualLinearPredictiveCoefficientsAnalysis !=
                  (_func_int **)&local_3f0.compression_factor_) {
                operator_delete(local_3f0._vptr_PerceptualLinearPredictiveCoefficientsAnalysis);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7c8);
              std::ios_base::~ios_base(local_758);
              iVar6 = 1;
            }
            sptk::SpectrumToSpectrum::~SpectrumToSpectrum(&local_2f8);
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7c8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_7c8,"Cannot open file ",0x11);
            sVar9 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_7c8,__s,sVar9);
            local_3f0._vptr_PerceptualLinearPredictiveCoefficientsAnalysis =
                 (_func_int **)&local_3f0.compression_factor_;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"plp","");
            sptk::PrintErrorMessage((string *)&local_3f0,(ostringstream *)local_7c8);
            if (local_3f0._vptr_PerceptualLinearPredictiveCoefficientsAnalysis !=
                (_func_int **)&local_3f0.compression_factor_) {
              operator_delete(local_3f0._vptr_PerceptualLinearPredictiveCoefficientsAnalysis);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7c8);
            std::ios_base::~ios_base(local_758);
            iVar6 = 1;
          }
          std::ifstream::~ifstream(&local_628);
          return iVar6;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_628);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_628,"Cannot set translation mode",0x1b);
        local_7c8[0]._M_dataplus._M_p = (pointer)&local_7c8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"plp","");
        sptk::PrintErrorMessage(local_7c8,(ostringstream *)&local_628);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_628);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_628,"Too many input files",0x14);
        local_7c8[0]._M_dataplus._M_p = (pointer)&local_7c8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"plp","");
        sptk::PrintErrorMessage(local_7c8,(ostringstream *)&local_628);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_628);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_628,
                 "Highest frequency must be less than or equal to Nyquist frequency",0x41);
      local_7c8[0]._M_dataplus._M_p = (pointer)&local_7c8[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"plp","");
      sptk::PrintErrorMessage(local_7c8,(ostringstream *)&local_628);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7c8[0]._M_dataplus._M_p != &local_7c8[0].field_2) {
      operator_delete(local_7c8[0]._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_628);
    std::ios_base::~ios_base(local_5b8);
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_channel(kDefaultNumChannel);
  int num_order(kDefaultNumOrder);
  int fft_length(kDefaultFftLength);
  int liftering_coefficient(kDefaultLifteringCoefficient);
  double compression_factor(kDefaultCompressionFactor);
  double sampling_rate(kDefaultSamplingRate);
  double lowest_frequency(kDefaultLowestFrequency);
  double highest_frequency(0.0);
  bool is_highest_frequency_specified(false);
  InputFormats input_format(kDefaultInputFormat);
  OutputFormats output_format(kDefaultOutputFormat);
  double floor(kDefaultFloor);

  for (;;) {
    const int option_char(
        getopt_long(argc, argv, "n:m:l:c:f:s:L:H:q:o:e:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'n': {
        if (!sptk::ConvertStringToInteger(optarg, &num_channel) ||
            num_channel <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -n option must be a positive integer";
          sptk::PrintErrorMessage("plp", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -m option must be a positive integer";
          sptk::PrintErrorMessage("plp", error_message);
          return 1;
        }
        break;
      }
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &fft_length)) {
          std::ostringstream error_message;
          error_message << "The argument for the -l option must be an integer";
          sptk::PrintErrorMessage("plp", error_message);
          return 1;
        }
        break;
      }
      case 'c': {
        if (!sptk::ConvertStringToInteger(optarg, &liftering_coefficient) ||
            liftering_coefficient <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -c option must be a positive integer";
          sptk::PrintErrorMessage("plp", error_message);
          return 1;
        }
        break;
      }
      case 'f': {
        if (!sptk::ConvertStringToDouble(optarg, &compression_factor) ||
            compression_factor <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -f option must be a positive number";
          sptk::PrintErrorMessage("plp", error_message);
          return 1;
        }
        break;
      }
      case 's': {
        if (!sptk::ConvertStringToDouble(optarg, &sampling_rate) ||
            sampling_rate <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -s option must be a positive number";
          sptk::PrintErrorMessage("plp", error_message);
          return 1;
        }
        break;
      }
      case 'L': {
        if (!sptk::ConvertStringToDouble(optarg, &lowest_frequency) ||
            lowest_frequency < 0.0) {
          std::ostringstream error_message;
          error_message << "The argument for the -L option must be a "
                        << "non-negative number";
          sptk::PrintErrorMessage("plp", error_message);
          return 1;
        }
        break;
      }
      case 'H': {
        if (!sptk::ConvertStringToDouble(optarg, &highest_frequency) ||
            highest_frequency <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -H option must be a positive number";
          sptk::PrintErrorMessage("plp", error_message);
          return 1;
        }
        is_highest_frequency_specified = true;
        break;
      }
      case 'q': {
        const int min(0);
        const int max(static_cast<int>(kNumInputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -q option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("plp", error_message);
          return 1;
        }
        input_format = static_cast<InputFormats>(tmp);
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(kNumOutputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("plp", error_message);
          return 1;
        }
        output_format = static_cast<OutputFormats>(tmp);
        break;
      }
      case 'e': {
        if (!sptk::ConvertStringToDouble(optarg, &floor) || floor <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -e option must be a positive number";
          sptk::PrintErrorMessage("plp", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const double sampling_rate_in_hz(1000.0 * sampling_rate);
  if (!is_highest_frequency_specified) {
    highest_frequency = 0.5 * sampling_rate_in_hz;
  } else if (0.5 * sampling_rate_in_hz < highest_frequency) {
    std::ostringstream error_message;
    error_message
        << "Highest frequency must be less than or equal to Nyquist frequency";
    sptk::PrintErrorMessage("plp", error_message);
    return 1;
  }

  if (highest_frequency <= lowest_frequency) {
    std::ostringstream error_message;
    error_message << "Lowest frequency must be less than highest one";
    sptk::PrintErrorMessage("plp", error_message);
    return 1;
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("plp", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("plp", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("plp", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::SpectrumToSpectrum spectrum_to_spectrum(
      fft_length,
      static_cast<sptk::SpectrumToSpectrum::InputOutputFormats>(input_format),
      sptk::SpectrumToSpectrum::InputOutputFormats::kPowerSpectrum);
  if (kWaveform != input_format && !spectrum_to_spectrum.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to set condition for input formatting";
    sptk::PrintErrorMessage("plp", error_message);
    return 1;
  }

  sptk::WaveformToSpectrum waveform_to_spectrum(
      fft_length, fft_length,
      sptk::SpectrumToSpectrum::InputOutputFormats::kPowerSpectrum);
  sptk::WaveformToSpectrum::Buffer buffer_for_spectral_analysis;
  if (kWaveform == input_format && !waveform_to_spectrum.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to set condition for spectral analysis";
    sptk::PrintErrorMessage("plp", error_message);
    return 1;
  }

  sptk::PerceptualLinearPredictiveCoefficientsAnalysis analysis(
      fft_length, num_channel, num_order, liftering_coefficient,
      compression_factor, sampling_rate_in_hz, lowest_frequency,
      highest_frequency, floor);
  sptk::PerceptualLinearPredictiveCoefficientsAnalysis::Buffer
      buffer_for_plp_analysis;
  if (!analysis.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to set condition for PLP analysis";
    sptk::PrintErrorMessage("plp", error_message);
    return 1;
  }

  const int input_length(kWaveform == input_format ? fft_length
                                                   : fft_length / 2 + 1);
  const int output_length(num_order);
  std::vector<double> input(input_length);
  std::vector<double> processed_input(fft_length / 2 + 1);
  std::vector<double> output(output_length);
  double energy(0.0);

  while (sptk::ReadStream(false, 0, 0, input_length, &input, &input_stream,
                          NULL)) {
    if (kWaveform != input_format) {
      if (!spectrum_to_spectrum.Run(input, &processed_input)) {
        std::ostringstream error_message;
        error_message << "Failed to convert spectrum";
        sptk::PrintErrorMessage("plp", error_message);
        return 1;
      }
    } else {
      if (!waveform_to_spectrum.Run(input, &processed_input,
                                    &buffer_for_spectral_analysis)) {
        std::ostringstream error_message;
        error_message << "Failed to transform waveform to spectrum";
        sptk::PrintErrorMessage("plp", error_message);
        return 1;
      }
    }

    if (!analysis.Run(processed_input, &output,
                      (kPlpAndEnergy == output_format ||
                       kPlpAndC0AndEnergy == output_format)
                          ? &energy
                          : NULL,
                      &buffer_for_plp_analysis)) {
      std::ostringstream error_message;
      error_message << "Failed to run PLP analysis";
      sptk::PrintErrorMessage("plp", error_message);
      return 1;
    }

    if (!sptk::WriteStream(1, output_length, output, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write PLP";
      sptk::PrintErrorMessage("plp", error_message);
      return 1;
    }

    if (kPlpAndC0 == output_format || kPlpAndC0AndEnergy == output_format) {
      if (!sptk::WriteStream(output[0], &std::cout)) {
        std::ostringstream error_message;
        error_message << "Failed to write c0";
        sptk::PrintErrorMessage("plp", error_message);
        return 1;
      }
    }

    if (kPlpAndEnergy == output_format || kPlpAndC0AndEnergy == output_format) {
      if (!sptk::WriteStream(energy, &std::cout)) {
        std::ostringstream error_message;
        error_message << "Failed to write energy";
        sptk::PrintErrorMessage("plp", error_message);
        return 1;
      }
    }
  }

  return 0;
}